

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::AggressiveDCEPass::ProcessImpl(AggressiveDCEPass *this)

{
  Module *pMVar1;
  pointer puVar2;
  pointer ppIVar3;
  bool bVar4;
  bool bVar5;
  FeatureManager *pFVar6;
  byte bVar7;
  Status SVar8;
  iterator __begin2;
  pointer ppIVar9;
  pointer puVar10;
  
  pFVar6 = IRContext::get_feature_mgr((this->super_MemPass).super_Pass.context_);
  bVar4 = EnumSet<spv::Capability>::contains(&pFVar6->capabilities_,CapabilityShader);
  SVar8 = SuccessWithoutChange;
  if (bVar4) {
    pFVar6 = IRContext::get_feature_mgr((this->super_MemPass).super_Pass.context_);
    bVar4 = EnumSet<spv::Capability>::contains(&pFVar6->capabilities_,Addresses);
    if (!bVar4) {
      pFVar6 = IRContext::get_feature_mgr((this->super_MemPass).super_Pass.context_);
      bVar4 = EnumSet<spv::Capability>::contains
                        (&pFVar6->capabilities_,CapabilityVariablePointersStorageBuffer);
      if (!bVar4) {
        bVar4 = AllExtensionsSupported(this);
        if (bVar4) {
          bVar4 = EliminateDeadFunctions(this);
          InitializeModuleScopeLiveInstructions(this);
          pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                   .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
          puVar2 = *(pointer *)
                    ((long)&(pMVar1->functions_).
                            super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                    + 8);
          for (puVar10 = *(pointer *)
                          &(pMVar1->functions_).
                           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                           ._M_impl; puVar10 != puVar2; puVar10 = puVar10 + 1) {
            bVar5 = AggressiveDCE(this,(Function *)
                                       (puVar10->_M_t).
                                       super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                 );
            bVar4 = (bool)(bVar4 | bVar5);
          }
          IRContext::InvalidateAnalyses
                    ((this->super_MemPass).super_Pass.context_,kAnalysisDecorations);
          bVar5 = ProcessGlobalValues(this);
          bVar7 = bVar4 | bVar5;
          ppIVar9 = (this->to_kill_).
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppIVar3 = (this->to_kill_).
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((ppIVar9 != ppIVar3) && (bVar7 == 0)) {
            __assert_fail("(to_kill_.empty() || modified) && \"A dead instruction was identified, but no change recorded.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                          ,0x2e2,"Pass::Status spvtools::opt::AggressiveDCEPass::ProcessImpl()");
          }
          for (; ppIVar9 != ppIVar3; ppIVar9 = ppIVar9 + 1) {
            IRContext::KillInst((this->super_MemPass).super_Pass.context_,*ppIVar9);
          }
          pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                   .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
          puVar2 = *(pointer *)
                    ((long)&(pMVar1->functions_).
                            super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                    + 8);
          for (puVar10 = *(pointer *)
                          &(pMVar1->functions_).
                           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                           ._M_impl; puVar10 != puVar2; puVar10 = puVar10 + 1) {
            bVar4 = MemPass::CFGCleanup(&this->super_MemPass,
                                        (Function *)
                                        (puVar10->_M_t).
                                        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                       );
            bVar7 = bVar7 | bVar4;
          }
          SVar8 = bVar7 ^ SuccessWithoutChange;
        }
      }
    }
  }
  return SVar8;
}

Assistant:

Pass::Status AggressiveDCEPass::ProcessImpl() {
  // Current functionality assumes shader capability
  // TODO(greg-lunarg): Handle additional capabilities
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return Status::SuccessWithoutChange;

  // Current functionality assumes relaxed logical addressing (see
  // instruction.h)
  // TODO(greg-lunarg): Handle non-logical addressing
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Addresses))
    return Status::SuccessWithoutChange;

  // The variable pointer extension is no longer needed to use the capability,
  // so we have to look for the capability.
  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::VariablePointersStorageBuffer))
    return Status::SuccessWithoutChange;

  // If any extensions in the module are not explicitly supported,
  // return unmodified.
  if (!AllExtensionsSupported()) return Status::SuccessWithoutChange;

  // Eliminate Dead functions.
  bool modified = EliminateDeadFunctions();

  InitializeModuleScopeLiveInstructions();

  // Run |AggressiveDCE| on the remaining functions.  The order does not matter,
  // since |AggressiveDCE| is intra-procedural.  This can mean that function
  // will become dead if all function call to them are removed.  These dead
  // function will still be in the module after this pass.  We expect this to be
  // rare.
  for (Function& fp : *context()->module()) {
    modified |= AggressiveDCE(&fp);
  }

  // If the decoration manager is kept live then the context will try to keep it
  // up to date.  ADCE deals with group decorations by changing the operands in
  // |OpGroupDecorate| instruction directly without informing the decoration
  // manager.  This can put it in an invalid state which will cause an error
  // when the context tries to update it.  To avoid this problem invalidate
  // the decoration manager upfront.
  //
  // We kill it at now because it is used when processing the entry point
  // functions.
  context()->InvalidateAnalyses(IRContext::Analysis::kAnalysisDecorations);

  // Process module-level instructions. Now that all live instructions have
  // been marked, it is safe to remove dead global values.
  modified |= ProcessGlobalValues();

  assert((to_kill_.empty() || modified) &&
         "A dead instruction was identified, but no change recorded.");

  // Kill all dead instructions.
  for (auto inst : to_kill_) {
    context()->KillInst(inst);
  }

  // Cleanup all CFG including all unreachable blocks.
  for (Function& fp : *context()->module()) {
    modified |= CFGCleanup(&fp);
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}